

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O0

bool __thiscall efsw::WatcherGeneric::pathInWatches(WatcherGeneric *this,string *path)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  string local_38 [32];
  string *local_18;
  string *path_local;
  WatcherGeneric *this_local;
  
  this_00 = this->DirWatch;
  local_18 = path;
  path_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)path);
  bVar1 = DirWatcherGeneric::pathInWatches(this_00,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool WatcherGeneric::pathInWatches( std::string path ) {
	return DirWatch->pathInWatches( path );
}